

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

UBool __thiscall
icu_63::CopyHelper::copyRangeCE32(CopyHelper *this,UChar32 start,UChar32 end,uint32_t ce32)

{
  UBool UVar1;
  uint32_t value;
  uint32_t ce32_local;
  UChar32 end_local;
  UChar32 start_local;
  CopyHelper *this_local;
  
  value = copyCE32(this,ce32);
  utrie2_setRange32_63(this->dest->trie,start,end,value,'\x01',&this->errorCode);
  UVar1 = CollationDataBuilder::isBuilderContextCE32(value);
  if (UVar1 != '\0') {
    UnicodeSet::add(&this->dest->contextChars,start,end);
  }
  UVar1 = ::U_SUCCESS(this->errorCode);
  return UVar1;
}

Assistant:

UBool copyRangeCE32(UChar32 start, UChar32 end, uint32_t ce32) {
        ce32 = copyCE32(ce32);
        utrie2_setRange32(dest.trie, start, end, ce32, TRUE, &errorCode);
        if(CollationDataBuilder::isBuilderContextCE32(ce32)) {
            dest.contextChars.add(start, end);
        }
        return U_SUCCESS(errorCode);
    }